

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

int arkStep_TakeStep_Z(ARKodeMem ark_mem,sunrealtype *dsmPtr,int *nflagPtr)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint istage;
  int *in_RDX;
  ARKodeMem in_RDI;
  bool bVar7;
  SUNErrCode errcode_2;
  int do_save_2;
  SUNErrCode errcode_1;
  int do_save_1;
  int res_full_rhs;
  SUNErrCode errcode;
  int do_save;
  N_Vector zcor0;
  ARKodeARKStepMem step_mem;
  int eval_rhs;
  int save_fn_for_residual;
  int imex_method;
  int save_fn_for_interp;
  int stiffly_accurate;
  int save_stages;
  int deduce_stage;
  int implicit_stage;
  int mode;
  int is_start;
  int is;
  int retval;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  char *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  byte local_80;
  bool local_7e;
  bool local_7d;
  int local_78;
  int local_74;
  int local_70;
  uint in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  N_Vector in_stack_ffffffffffffffa0;
  ARKodeMem in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffc8;
  uint uVar8;
  uint local_2c;
  uint local_28;
  int local_4;
  
  iVar2 = arkStep_AccessStepMem
                    ((ARKodeMem)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                     in_stack_ffffffffffffff70,
                     (ARKodeARKStepMem *)
                     CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if (iVar2 != 0) {
    return iVar2;
  }
  if ((*(int *)&in_stack_ffffffffffffffa8->reltol == 0) &&
     (*(int *)&in_stack_ffffffffffffffa8->step_setnlsrhsfn == 0)) {
    *in_RDX = 0;
  }
  if ((in_stack_ffffffffffffffa8->step_mem != (void *)0x0) &&
     (*(long *)(*(long *)((long)in_stack_ffffffffffffffa8->step_mem + 8) + 0x10) != 0)) {
    in_stack_ffffffffffffffa0 = in_RDI->tempv3;
    N_VConst(in_stack_ffffffffffffffa0);
    iVar2 = SUNNonlinSolSetup(in_stack_ffffffffffffffa8->step_mem,in_stack_ffffffffffffffa0,in_RDI);
    if (iVar2 < 0) {
      return -0x1e;
    }
    if (0 < iVar2) {
      return -0x1f;
    }
  }
  iVar2 = 0;
  if ((in_RDI->relax_enabled != 0) &&
     ((*(int *)&in_stack_ffffffffffffffa8->reltol != 0 ||
      (*(int *)&in_stack_ffffffffffffffa8->step_setnlsrhsfn == 1)))) {
    iVar2 = 1;
  }
  local_7d = false;
  if (*(int *)&in_stack_ffffffffffffffa8->reltol != 0) {
    local_7d = in_stack_ffffffffffffffa8->ritol != 0;
  }
  uVar3 = (uint)local_7d;
  uVar8 = 0;
  local_2c = 1;
  if (*(int *)&in_stack_ffffffffffffffa8->reltol != 0) {
    bVar7 = 1e-10 < ABS(*(double *)**(undefined8 **)((long)in_stack_ffffffffffffffa8->r_data + 0x10)
                       );
    local_2c = (uint)!bVar7;
    uVar8 = (uint)bVar7;
  }
  if (local_2c == 1) {
    if (iVar2 != 0) {
      N_VScale(0x3ff0000000000000,in_RDI->yn,*(undefined8 *)in_stack_ffffffffffffffa8->SRabstol);
    }
    if (in_RDI->checkpoint_scheme != (SUNAdjointCheckpointScheme)0x0) {
      iVar4 = SUNAdjointCheckpointScheme_NeedsSaving
                        (in_RDI->tcur,in_RDI->checkpoint_scheme,in_RDI->checkpoint_step_idx,0,
                         &stack0xffffffffffffff9c);
      if (iVar4 != 0) {
        arkProcessError(in_RDI,-0x35,0x6cc,"arkStep_TakeStep_Z",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                        ,"SUNAdjointCheckpointScheme_NeedsSaving returned %d",iVar4);
        return -0x35;
      }
      if ((in_stack_ffffffffffffff9c != 0) &&
         (iVar4 = SUNAdjointCheckpointScheme_InsertVector
                            (in_RDI->tcur,in_RDI->checkpoint_scheme,in_RDI->checkpoint_step_idx,0,
                             in_RDI->ycur), iVar4 != 0)) {
        arkProcessError(in_RDI,-0x35,0x6dc,"arkStep_TakeStep_Z",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                        ,"SUNAdjointCheckpointScheme_InsertVector returned %d",iVar4);
        return -0x35;
      }
      in_stack_ffffffffffffff98 = 0;
    }
  }
  iVar4 = 1;
  if ((in_stack_ffffffffffffffa8->ritol != 0) &&
     (iVar5 = ARKodeButcherTable_IsStifflyAccurate
                        ((ARKodeButcherTable)in_stack_ffffffffffffffa8->rfun), iVar5 == 0)) {
    iVar4 = 0;
  }
  if ((*(int *)&in_stack_ffffffffffffffa8->reltol != 0) &&
     (iVar5 = ARKodeButcherTable_IsStifflyAccurate
                        ((ARKodeButcherTable)in_stack_ffffffffffffffa8->r_data), iVar5 == 0)) {
    iVar4 = 0;
  }
  uVar6 = (uint)(in_RDI->interp_type == 0);
  local_7e = false;
  if (((*(int *)&in_stack_ffffffffffffffa8->reltol != 0) &&
      (local_7e = false, *(int *)&in_stack_ffffffffffffffa8->step_resize == 0)) &&
     (local_7e = false, *(int *)&in_stack_ffffffffffffffa8->user_data != 0)) {
    local_7e = *(int *)&in_stack_ffffffffffffffa8->step_setnlsrhsfn != 2;
  }
  istage = (uint)local_7e;
  bVar7 = true;
  if ((uVar8 != 0) && (bVar7 = true, uVar6 == 0)) {
    bVar7 = istage != 0;
  }
  if ((in_RDI->fn_is_current == 0) && (bVar7)) {
    local_80 = 0;
    if ((istage != 0) && (local_80 = 0, uVar8 != 0)) {
      local_80 = uVar3 != 0 ^ 0xff;
    }
    in_stack_ffffffffffffff94 = (uint)(local_80 & 1);
    if (((uVar8 == 0) || (uVar6 != 0)) || (in_stack_ffffffffffffff94 != 0)) {
      iVar5 = (*in_RDI->step_fullrhs)
                        (in_RDI,in_RDI->tn,in_RDI->yn,in_RDI->fn,SUB14(in_RDI->initsetup == 0,0));
      if (iVar5 != 0) {
        return -8;
      }
      in_RDI->fn_is_current = 1;
    }
    else if (iVar4 == 0) {
      iVar5 = (*(code *)in_stack_ffffffffffffffa8->uround)
                        (in_RDI->tn,in_RDI->yn,**(undefined8 **)&in_stack_ffffffffffffffa8->atolmin0
                         ,in_RDI->user_data);
      in_stack_ffffffffffffffa8->step_setnonlincrdown =
           in_stack_ffffffffffffffa8->step_setnonlincrdown + 1;
      if (iVar5 < 0) {
        return -8;
      }
      if (0 < iVar5) {
        return -0xb;
      }
    }
    else {
      N_VScale(0x3ff0000000000000,
               *(undefined8 *)
                (*(long *)&in_stack_ffffffffffffffa8->atolmin0 +
                (long)(*(int *)&in_stack_ffffffffffffffa8->field_0x6c + -1) * 8),
               **(undefined8 **)&in_stack_ffffffffffffffa8->atolmin0);
    }
  }
  *(undefined8 *)&in_stack_ffffffffffffffa8->step_supports_relaxation = 0;
  if (istage != 0) {
    if (uVar8 == 0) {
      *(undefined8 *)&in_stack_ffffffffffffffa8->step_supports_relaxation =
           **(undefined8 **)&in_stack_ffffffffffffffa8->atolmin0;
    }
    else if ((uVar3 == 0) && (*(int *)&in_stack_ffffffffffffffa8->step_setnlsrhsfn != 1)) {
      *(N_Vector *)&in_stack_ffffffffffffffa8->step_supports_relaxation = in_RDI->fn;
    }
    else {
      N_VScale(0x3ff0000000000000,**(undefined8 **)&in_stack_ffffffffffffffa8->atolmin0,
               in_RDI->tempv5);
      *(N_Vector *)&in_stack_ffffffffffffffa8->step_supports_relaxation = in_RDI->tempv5;
    }
  }
  local_28 = local_2c;
  while( true ) {
    if (*(int *)&in_stack_ffffffffffffffa8->field_0x6c <= (int)local_28) {
      if (*(int *)&in_stack_ffffffffffffffa8->step_setnlsrhsfn == 1) {
        iVar2 = arkStep_ComputeSolutions_MassFixed
                          (in_stack_ffffffffffffffa8,(sunrealtype *)in_stack_ffffffffffffffa0);
        *in_RDX = iVar2;
      }
      else {
        iVar2 = arkStep_ComputeSolutions
                          ((ARKodeMem)CONCAT44(uVar8,in_stack_ffffffffffffffc8),
                           (sunrealtype *)CONCAT44(iVar2,iVar4));
        *in_RDX = iVar2;
      }
      if (*in_RDX < 0) {
        local_4 = *in_RDX;
      }
      else if (*in_RDX < 1) {
        if (in_RDI->checkpoint_scheme != (SUNAdjointCheckpointScheme)0x0) {
          iVar2 = SUNAdjointCheckpointScheme_NeedsSaving
                            (in_RDI->tn + in_RDI->h,in_RDI->checkpoint_scheme,
                             in_RDI->checkpoint_step_idx,
                             (long)*(int *)(in_stack_ffffffffffffffa8->rfun + 8),&local_78);
          if (iVar2 != 0) {
            arkProcessError(in_RDI,-0x35,0x88e,"arkStep_TakeStep_Z",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                            ,"SUNAdjointCheckpointScheme_NeedsSaving returned %d",iVar2);
            return -0x35;
          }
          if ((local_78 != 0) &&
             (iVar2 = SUNAdjointCheckpointScheme_InsertVector
                                (in_RDI->tn + in_RDI->h,in_RDI->checkpoint_scheme,
                                 in_RDI->checkpoint_step_idx,
                                 (long)*(int *)(in_stack_ffffffffffffffa8->rfun + 8),in_RDI->ycur),
             iVar2 != 0)) {
            arkProcessError(in_RDI,-0x35,0x89e,"arkStep_TakeStep_Z",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                            ,"SUNAdjointCheckpointScheme_NeedsSaving returned %d",iVar2);
            return -0x35;
          }
        }
        local_4 = 0;
      }
      else {
        local_4 = 5;
      }
      return local_4;
    }
    in_stack_ffffffffffffffa8->user_rfun = local_28;
    uVar8 = 0;
    if (*(int *)&in_stack_ffffffffffffffa8->reltol != 0) {
      uVar8 = (uint)(1e-10 < ABS(*(double *)
                                  (*(long *)(*(long *)((long)in_stack_ffffffffffffffa8->r_data +
                                                      0x10) + (long)(int)local_28 * 8) +
                                  (long)(int)local_28 * 8)));
    }
    in_stack_ffffffffffffffc8 =
         (uint)(*(int *)((long)&in_stack_ffffffffffffffa8->reltol + 4) != 0 && uVar8 != 0);
    if (*(int *)&in_stack_ffffffffffffffa8->reltol == 0) {
      in_RDI->tcur = *(double *)
                      (*(long *)(in_stack_ffffffffffffffa8->rfun + 0x18) + (long)(int)local_28 * 8)
                     * in_RDI->h + in_RDI->tn;
    }
    else {
      in_RDI->tcur = *(double *)
                      (*(long *)((long)in_stack_ffffffffffffffa8->r_data + 0x18) +
                      (long)(int)local_28 * 8) * in_RDI->h + in_RDI->tn;
    }
    if (((*(int *)&in_stack_ffffffffffffffa8->step_setnlsrhsfn == 2) &&
        (in_stack_ffffffffffffffa8->step_computestate != (ARKTimestepComputeState)0x0)) &&
       (iVar5 = (*in_stack_ffffffffffffffa8->step_computestate)
                          (in_RDI,in_RDI->tempv1,in_RDI->tempv2), iVar5 != 0)) {
      return -0xf;
    }
    if (uVar8 != 0) {
      iVar5 = arkStep_Predict((ARKodeMem)CONCAT44(uVar6,uVar3),istage,
                              (N_Vector)in_stack_ffffffffffffffa8);
      if (iVar5 != 0) {
        return iVar5;
      }
      if (*(long *)&in_stack_ffffffffffffffa8->constraintsSet != 0) {
        uVar1._0_4_ = in_stack_ffffffffffffffa8->Ratolmin0;
        uVar1._4_4_ = in_stack_ffffffffffffffa8->user_efun;
        iVar5 = (**(code **)&in_stack_ffffffffffffffa8->constraintsSet)
                          (in_RDI->tcur,uVar1,in_RDI->user_data);
        if (iVar5 < 0) {
          return -0x27;
        }
        if (0 < iVar5) {
          return 5;
        }
      }
    }
    iVar5 = arkStep_StageSetup((ARKodeMem)CONCAT44(uVar6,uVar3),istage);
    if (iVar5 != 0) {
      return iVar5;
    }
    if (uVar8 == 0) {
      if (*(int *)&in_stack_ffffffffffffffa8->step_setnlsrhsfn == 1) {
        iVar5 = (*in_stack_ffffffffffffffa8->step_setlinear)
                          (in_RDI,(int)in_stack_ffffffffffffffa8->VRabstol);
        *in_RDX = iVar5;
        if (*in_RDX != 0) {
          return 5;
        }
      }
      N_VLinearSum(in_RDI->yn,in_stack_ffffffffffffffa8->VRabstol,in_RDI->ycur);
    }
    else {
      iVar5 = arkStep_Nls((ARKodeMem)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                          in_stack_ffffffffffffff94);
      *in_RDX = iVar5;
      if (*in_RDX != 0) {
        return 5;
      }
    }
    if ((in_RDI->ProcessStage != (ARKPostProcessFn)0x0) &&
       (iVar5 = (*in_RDI->ProcessStage)(in_RDI->tcur,in_RDI->ycur,in_RDI->user_data), iVar5 != 0))
    break;
    if (iVar2 != 0) {
      N_VScale(0x3ff0000000000000,in_RDI->ycur,
               *(undefined8 *)((long)in_stack_ffffffffffffffa8->SRabstol + (long)(int)local_28 * 8))
      ;
    }
    if (in_RDI->checkpoint_scheme != (SUNAdjointCheckpointScheme)0x0) {
      local_74 = SUNAdjointCheckpointScheme_NeedsSaving
                           (in_RDI->tcur,in_RDI->checkpoint_scheme,in_RDI->checkpoint_step_idx,
                            (long)(int)local_28,&local_70);
      if (local_74 != 0) {
        arkProcessError(in_RDI,-0x35,0x7f6,"arkStep_TakeStep_Z",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                        ,"SUNAdjointCheckpointScheme_NeedsSaving returned %d",local_74);
        return -0x35;
      }
      if ((local_70 != 0) &&
         (local_74 = SUNAdjointCheckpointScheme_InsertVector
                               (in_RDI->tcur,in_RDI->checkpoint_scheme,in_RDI->checkpoint_step_idx,
                                (long)(int)local_28,in_RDI->ycur), local_74 != 0)) {
        arkProcessError(in_RDI,-0x35,0x807,"arkStep_TakeStep_Z",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                        ,"SUNAdjointCheckpointScheme_InsertVector returned %d",local_74);
        return -0x35;
      }
      local_74 = 0;
    }
    if (*(int *)&in_stack_ffffffffffffffa8->reltol != 0) {
      if (in_stack_ffffffffffffffc8 == 0) {
        iVar5 = (*(code *)in_stack_ffffffffffffffa8->uround)
                          (in_RDI->tcur,in_RDI->ycur,
                           *(undefined8 *)
                            (*(long *)&in_stack_ffffffffffffffa8->atolmin0 + (long)(int)local_28 * 8
                            ),in_RDI->user_data);
        in_stack_ffffffffffffffa8->step_setnonlincrdown =
             in_stack_ffffffffffffffa8->step_setnonlincrdown + 1;
        if (iVar5 < 0) {
          return -8;
        }
        if (0 < iVar5) {
          return -0xb;
        }
      }
      else if (*(int *)&in_stack_ffffffffffffffa8->step_setnlsrhsfn == 1) {
        iVar5 = (*in_stack_ffffffffffffffa8->step_setnonlinearsolver)
                          (in_RDI,(SUNNonlinearSolver)in_stack_ffffffffffffffa8->efun);
        if (iVar5 != 0) {
          return -0x12;
        }
        N_VLinearSum(1.0 / (double)in_stack_ffffffffffffffa8->step,
                     SUB84(-1.0 / (double)in_stack_ffffffffffffffa8->step,0),in_RDI->tempv1,
                     in_stack_ffffffffffffffa8->VRabstol,
                     *(undefined8 *)
                      (*(long *)&in_stack_ffffffffffffffa8->atolmin0 + (long)(int)local_28 * 8));
      }
      else {
        N_VLinearSum(1.0 / (double)in_stack_ffffffffffffffa8->step,
                     SUB84(-1.0 / (double)in_stack_ffffffffffffffa8->step,0),
                     in_stack_ffffffffffffffa8->efun,in_stack_ffffffffffffffa8->VRabstol,
                     *(undefined8 *)
                      (*(long *)&in_stack_ffffffffffffffa8->atolmin0 + (long)(int)local_28 * 8));
      }
    }
    if (in_stack_ffffffffffffffa8->ritol != 0) {
      iVar5 = (*(code *)in_stack_ffffffffffffffa8->sunctx)
                        (*(double *)
                          (*(long *)(in_stack_ffffffffffffffa8->rfun + 0x18) +
                          (long)(int)local_28 * 8) * in_RDI->h + in_RDI->tn,in_RDI->ycur,
                         (&in_stack_ffffffffffffffa8->Vabstol->content)[(int)local_28],
                         in_RDI->user_data);
      in_stack_ffffffffffffffa8->step_setdeduceimplicitrhs =
           in_stack_ffffffffffffffa8->step_setdeduceimplicitrhs + 1;
      if (iVar5 < 0) {
        return -8;
      }
      if (0 < iVar5) {
        return -0xb;
      }
    }
    if (*(int *)&in_stack_ffffffffffffffa8->step_setnlsrhsfn == 2) {
      if ((*(int *)&in_stack_ffffffffffffffa8->reltol != 0) && (in_stack_ffffffffffffffc8 == 0)) {
        iVar5 = (*in_stack_ffffffffffffffa8->step_setlinear)
                          (in_RDI,(int)*(undefined8 *)
                                        (*(long *)&in_stack_ffffffffffffffa8->atolmin0 +
                                        (long)(int)local_28 * 8));
        *in_RDX = iVar5;
        if (*in_RDX != 0) {
          return 5;
        }
      }
      if (in_stack_ffffffffffffffa8->ritol != 0) {
        iVar5 = (*in_stack_ffffffffffffffa8->step_setlinear)
                          (in_RDI,(int)(&in_stack_ffffffffffffffa8->Vabstol->content)[(int)local_28]
                          );
        *in_RDX = iVar5;
        if (*in_RDX != 0) {
          return 5;
        }
      }
    }
    local_28 = local_28 + 1;
  }
  return -0x26;
}

Assistant:

int arkStep_TakeStep_Z(ARKodeMem ark_mem, sunrealtype* dsmPtr, int* nflagPtr)
{
  int retval, is, is_start, mode;
  sunbooleantype implicit_stage;
  sunbooleantype deduce_stage;
  sunbooleantype save_stages;
  sunbooleantype stiffly_accurate;
  sunbooleantype save_fn_for_interp;
  sunbooleantype imex_method;
  sunbooleantype save_fn_for_residual;
  sunbooleantype eval_rhs;
  ARKodeARKStepMem step_mem;
  N_Vector zcor0;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* if problem will involve no algebraic solvers, initialize nflagPtr to success */
  if ((!step_mem->implicit) && (step_mem->mass_type == MASS_IDENTITY))
  {
    *nflagPtr = ARK_SUCCESS;
  }

  /* call nonlinear solver setup if it exists */
  if (step_mem->NLS)
  {
    if ((step_mem->NLS)->ops->setup)
    {
      zcor0 = ark_mem->tempv3;
      N_VConst(ZERO,
               zcor0); /* set guess to all 0 (since using predictor-corrector form) */
      retval = SUNNonlinSolSetup(step_mem->NLS, zcor0, ark_mem);

      SUNLogInfoIf(retval != 0, ARK_LOGGER, "setup-nonlinear-solver",
                   "status = failed nonlinear solver setup, retval = %i", retval);

      if (retval < 0) { return (ARK_NLS_SETUP_FAIL); }
      if (retval > 0) { return (ARK_NLS_SETUP_RECVR); }
    }
  }

  /* check if we need to store stage values */
  save_stages = SUNFALSE;
  if (ark_mem->relax_enabled &&
      (step_mem->implicit || step_mem->mass_type == MASS_FIXED))
  {
    save_stages = SUNTRUE;
  }

  /* check for an ImEx method */
  imex_method = step_mem->implicit && step_mem->explicit;

  /* check for implicit method with an explicit first stage */
  implicit_stage = SUNFALSE;
  is_start       = 1;
  if (step_mem->implicit)
  {
    if (SUNRabs(step_mem->Bi->A[0][0]) > TINY)
    {
      implicit_stage = SUNTRUE;
      is_start       = 0;
    }
  }

  /* explicit first stage -- store stage if necessary for relaxation or checkpointing */
  if (is_start == 1)
  {
    if (save_stages) { N_VScale(ONE, ark_mem->yn, step_mem->z[0]); }

    if (ark_mem->checkpoint_scheme)
    {
      sunbooleantype do_save;
      SUNErrCode errcode =
        SUNAdjointCheckpointScheme_NeedsSaving(ark_mem->checkpoint_scheme,
                                               ark_mem->checkpoint_step_idx, 0,
                                               ark_mem->tcur, &do_save);
      if (errcode)
      {
        arkProcessError(ark_mem, ARK_ADJ_CHECKPOINT_FAIL, __LINE__, __func__,
                        __FILE__,
                        "SUNAdjointCheckpointScheme_NeedsSaving returned %d",
                        errcode);
        return ARK_ADJ_CHECKPOINT_FAIL;
      }

      if (do_save)
      {
        errcode =
          SUNAdjointCheckpointScheme_InsertVector(ark_mem->checkpoint_scheme,
                                                  ark_mem->checkpoint_step_idx, 0,
                                                  ark_mem->tcur, ark_mem->ycur);

        if (errcode)
        {
          arkProcessError(ark_mem, ARK_ADJ_CHECKPOINT_FAIL, __LINE__, __func__,
                          __FILE__,
                          "SUNAdjointCheckpointScheme_InsertVector returned %d",
                          errcode);
          return ARK_ADJ_CHECKPOINT_FAIL;
        }
      }
    }
  }

  /* check if the method is Stiffly Accurate (SA) */
  stiffly_accurate = SUNTRUE;
  if (step_mem->explicit)
  {
    if (!ARKodeButcherTable_IsStifflyAccurate(step_mem->Be))
    {
      stiffly_accurate = SUNFALSE;
    }
  }

  if (step_mem->implicit)
  {
    if (!ARKodeButcherTable_IsStifflyAccurate(step_mem->Bi))
    {
      stiffly_accurate = SUNFALSE;
    }
  }

  /* Save f(tn, yn) for Hermite interpolation */
  save_fn_for_interp = ark_mem->interp_type == ARK_INTERP_HERMITE;

  /* For an implicit or ImEx method using the trivial predictor with an
     autonomous problem with an identity or fixed mass matrix, save fi(tn, yn)
     for reuse in the first residual evaluation of each stage solve */
  save_fn_for_residual = step_mem->implicit && step_mem->predictor == 0 &&
                         step_mem->autonomous &&
                         step_mem->mass_type != MASS_TIMEDEP;

  SUNLogInfoIf(is_start == 1, ARK_LOGGER, "begin-stage",
               "stage = %i, implicit = %i, tcur = " SUN_FORMAT_G, 0,
               implicit_stage, ark_mem->tcur);
  SUNLogExtraDebugVecIf(is_start == 1, ARK_LOGGER, "explicit stage",
                        ark_mem->yn, "z_0(:) =");

  /* Call the RHS if needed. */
  eval_rhs = !implicit_stage || save_fn_for_interp || save_fn_for_residual;

  if (!(ark_mem->fn_is_current) && eval_rhs)
  {
    /* If saving the RHS evaluation for reuse in the residual, call the full RHS
       for all implicit methods or for ImEx methods with an explicit first
       stage. ImEx methods with an implicit first stage may not need to evaluate
       fe depending on the interpolation type (covered by save_fn_for_interp) */
    sunbooleantype res_full_rhs = save_fn_for_residual && implicit_stage &&
                                  !imex_method;

    if (!implicit_stage || save_fn_for_interp || res_full_rhs)
    {
      /* Need full RHS evaluation. If this is the first step, then we evaluate
         or copy the RHS values from an earlier evaluation (e.g., to compute
         h0). For subsequent steps treat this call as an evaluation at the end
         of the just completed step (tn, yn) and potentially reuse the
         evaluation (FSAL method) or save the value for later use. */
      mode   = (ark_mem->initsetup) ? ARK_FULLRHS_START : ARK_FULLRHS_END;
      retval = ark_mem->step_fullrhs(ark_mem, ark_mem->tn, ark_mem->yn,
                                     ark_mem->fn, mode);
      if (retval)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed full rhs eval, retval = %i", retval);
        return ARK_RHSFUNC_FAIL;
      }
      ark_mem->fn_is_current = SUNTRUE;
    }
    else
    {
      /* For an ImEx method with implicit first stage and an interpolation
         method that does not need fn (e.g., Lagrange), only evaluate fi (if
         necessary) for reuse in the residual */
      if (stiffly_accurate)
      {
        N_VScale(ONE, step_mem->Fi[step_mem->stages - 1], step_mem->Fi[0]);
      }
      else
      {
        retval = step_mem->fi(ark_mem->tn, ark_mem->yn, step_mem->Fi[0],
                              ark_mem->user_data);
        step_mem->nfi++;

        SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                     "status = failed implicit rhs eval, retval = %i", retval);

        if (retval < 0) { return ARK_RHSFUNC_FAIL; }
        if (retval > 0) { return ARK_UNREC_RHSFUNC_ERR; }
      }
    }
  }

  /* Set alias to implicit RHS evaluation for reuse in residual */
  step_mem->fn_implicit = NULL;
  if (save_fn_for_residual)
  {
    if (!implicit_stage)
    {
      /* Explicit first stage -- Fi[0] will be retained */
      step_mem->fn_implicit = step_mem->Fi[0];
    }
    else
    {
      /* Implicit first stage -- Fi[0] will be overwritten */
      if (imex_method || step_mem->mass_type == MASS_FIXED)
      {
        /* Copy from Fi[0] as fn includes fe or M^{-1} */
        N_VScale(ONE, step_mem->Fi[0], ark_mem->tempv5);
        step_mem->fn_implicit = ark_mem->tempv5;
      }
      else
      {
        /* fn is the same as Fi[0] but will not be overwritten */
        step_mem->fn_implicit = ark_mem->fn;
      }
    }
  }

  SUNLogExtraDebugVecIf(is_start == 1 && step_mem->implicit, ARK_LOGGER,
                        "implicit RHS", step_mem->Fi[0], "Fi_0(:) =");
  SUNLogExtraDebugVecIf(is_start == 1 && step_mem->explicit, ARK_LOGGER,
                        "explicit RHS", step_mem->Fe[0], "Fe_0(:) =");
  SUNLogInfoIf(is_start == 1, ARK_LOGGER, "end-stage", "status = success");

  /* loop over internal stages to the step */
  for (is = is_start; is < step_mem->stages; is++)
  {
    /* store current stage index */
    step_mem->istage = is;

    /* determine whether implicit solve is required */
    implicit_stage = SUNFALSE;
    if (step_mem->implicit)
    {
      if (SUNRabs(step_mem->Bi->A[is][is]) > TINY) { implicit_stage = SUNTRUE; }
    }

    /* determine if the stage RHS will be deduced from the implicit solve */
    deduce_stage = step_mem->deduce_rhs && implicit_stage;

    /* set current stage time(s) */
    if (step_mem->implicit)
    {
      ark_mem->tcur = ark_mem->tn + step_mem->Bi->c[is] * ark_mem->h;
    }
    else { ark_mem->tcur = ark_mem->tn + step_mem->Be->c[is] * ark_mem->h; }

    SUNLogInfo(ARK_LOGGER, "begin-stage",
               "stage = %i, implicit = %i, tcur = " SUN_FORMAT_G, is,
               implicit_stage, ark_mem->tcur);

    /* setup time-dependent mass matrix */
    if ((step_mem->mass_type == MASS_TIMEDEP) && (step_mem->msetup != NULL))
    {
      retval = step_mem->msetup((void*)ark_mem, ark_mem->tcur, ark_mem->tempv1,
                                ark_mem->tempv2, ark_mem->tempv3);
      if (retval != ARK_SUCCESS)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed mass setup, retval = %i", retval);
        return (ARK_MASSSETUP_FAIL);
      }
    }

    /* if implicit, call built-in and user-supplied predictors
       (results placed in zpred) */
    if (implicit_stage)
    {
      retval = arkStep_Predict(ark_mem, is, step_mem->zpred);
      if (retval != ARK_SUCCESS)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed predict, retval = %i", retval);
        return (retval);
      }

      /* if a user-supplied predictor routine is provided, call that here.
         Note that arkStep_Predict is *still* called, so this user-supplied
         routine can just 'clean up' the built-in prediction, if desired. */
      if (step_mem->stage_predict)
      {
        retval = step_mem->stage_predict(ark_mem->tcur, step_mem->zpred,
                                         ark_mem->user_data);

        SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                     "status = failed predict, retval = %i", retval);
        if (retval < 0) { return (ARK_USER_PREDICT_FAIL); }
        if (retval > 0) { return (TRY_AGAIN); }
      }

      SUNLogExtraDebugVec(ARK_LOGGER, "predictor", step_mem->zpred, "zpred(:) =");
    }

    /* set up explicit data for evaluation of ARK stage (store in sdata) */
    retval = arkStep_StageSetup(ark_mem, implicit_stage);
    if (retval != ARK_SUCCESS)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed stage setup, retval = %i", retval);
      return (retval);
    }

    SUNLogExtraDebugVec(ARK_LOGGER, "rhs data", step_mem->sdata, "sdata(:) =");

    /* perform implicit solve if required */
    if (implicit_stage)
    {
      /* implicit solve result is stored in ark_mem->ycur;
         return with positive value on anything but success */
      *nflagPtr = arkStep_Nls(ark_mem, *nflagPtr);
      if (*nflagPtr != ARK_SUCCESS)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage", "status = failed solve, nflag = %i",
                   *nflagPtr);
        return (TRY_AGAIN);
      }

      SUNLogExtraDebugVec(ARK_LOGGER, "implicit stage", ark_mem->ycur,
                          "z_%i(:) =", is);

      /* otherwise no implicit solve is needed */
    }
    else
    {
      /* if M is fixed, solve with it to compute update (place back in sdata) */
      if (step_mem->mass_type == MASS_FIXED)
      {
        /* perform solve; return with positive value on anything but success */
        *nflagPtr = step_mem->msolve((void*)ark_mem, step_mem->sdata,
                                     step_mem->nlscoef);
        if (*nflagPtr != ARK_SUCCESS)
        {
          SUNLogInfo(ARK_LOGGER, "end-stage",
                     "status = failed mass solve, nflag = %i", *nflagPtr);
          return (TRY_AGAIN);
        }
      }

      /* set y to be yn + sdata (either computed in arkStep_StageSetup,
         or updated in prev. block) */
      N_VLinearSum(ONE, ark_mem->yn, ONE, step_mem->sdata, ark_mem->ycur);

      SUNLogExtraDebugVec(ARK_LOGGER, "explicit stage", ark_mem->ycur,
                          "z_%i(:) =", is);
    }

    /* apply user-supplied stage postprocessing function (if supplied) */
    /* NOTE: with internally inconsistent IMEX methods (c_i^E != c_i^I) the value
       of tcur corresponds to the stage time from the implicit table (c_i^I). */
    if (ark_mem->ProcessStage != NULL)
    {
      retval = ark_mem->ProcessStage(ark_mem->tcur, ark_mem->ycur,
                                     ark_mem->user_data);
      if (retval != 0)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed postprocess stage, retval = %i", retval);
        return (ARK_POSTPROCESS_STAGE_FAIL);
      }
    }

    /* successful stage solve */

    /*    store stage (if necessary for relaxation) */
    if (save_stages) { N_VScale(ONE, ark_mem->ycur, step_mem->z[is]); }

    /*    checkpoint stage for adjoint (if necessary) */
    if (ark_mem->checkpoint_scheme)
    {
      sunbooleantype do_save;
      SUNErrCode errcode =
        SUNAdjointCheckpointScheme_NeedsSaving(ark_mem->checkpoint_scheme,
                                               ark_mem->checkpoint_step_idx, is,
                                               ark_mem->tcur, &do_save);
      if (errcode)
      {
        arkProcessError(ark_mem, ARK_ADJ_CHECKPOINT_FAIL, __LINE__, __func__,
                        __FILE__,
                        "SUNAdjointCheckpointScheme_NeedsSaving returned %d",
                        errcode);
        return ARK_ADJ_CHECKPOINT_FAIL;
      }

      if (do_save)
      {
        errcode =
          SUNAdjointCheckpointScheme_InsertVector(ark_mem->checkpoint_scheme,
                                                  ark_mem->checkpoint_step_idx,
                                                  is, ark_mem->tcur,
                                                  ark_mem->ycur);

        if (errcode)
        {
          arkProcessError(ark_mem, ARK_ADJ_CHECKPOINT_FAIL, __LINE__, __func__,
                          __FILE__,
                          "SUNAdjointCheckpointScheme_InsertVector returned %d",
                          errcode);
          return ARK_ADJ_CHECKPOINT_FAIL;
        }
      }
    }

    /*    store implicit RHS (value in Fi[is] is from preceding nonlinear iteration) */
    if (step_mem->implicit)
    {
      if (!deduce_stage)
      {
        retval = step_mem->fi(ark_mem->tcur, ark_mem->ycur, step_mem->Fi[is],
                              ark_mem->user_data);
        step_mem->nfi++;

        SUNLogExtraDebugVec(ARK_LOGGER, "implicit RHS", step_mem->Fi[is],
                            "Fi_%i(:) =", is);
        SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                     "status = failed implicit rhs eval, retval = %i", retval);

        if (retval < 0) { return (ARK_RHSFUNC_FAIL); }
        if (retval > 0) { return (ARK_UNREC_RHSFUNC_ERR); }
      }
      else
      {
        if (step_mem->mass_type == MASS_FIXED)
        {
          retval = step_mem->mmult((void*)ark_mem, step_mem->zcor,
                                   ark_mem->tempv1);
          if (retval != ARK_SUCCESS)
          {
            SUNLogInfo(ARK_LOGGER, "end-stage",
                       "status = failed mass mult, retval = %i", retval);
            return (ARK_MASSMULT_FAIL);
          }

          N_VLinearSum(ONE / step_mem->gamma, ark_mem->tempv1,
                       -ONE / step_mem->gamma, step_mem->sdata, step_mem->Fi[is]);
        }
        else
        {
          N_VLinearSum(ONE / step_mem->gamma, step_mem->zcor,
                       -ONE / step_mem->gamma, step_mem->sdata, step_mem->Fi[is]);
        }

        SUNLogExtraDebugVec(ARK_LOGGER, "implicit RHS", step_mem->Fi[is],
                            "Fi_%i(:) =", is);
      }
    }

    /*    store explicit RHS */
    if (step_mem->explicit)
    {
      retval = step_mem->fe(ark_mem->tn + step_mem->Be->c[is] * ark_mem->h,
                            ark_mem->ycur, step_mem->Fe[is], ark_mem->user_data);
      step_mem->nfe++;

      SUNLogExtraDebugVec(ARK_LOGGER, "explicit RHS", step_mem->Fe[is],
                          "Fe_%i(:) =", is);
      SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                   "status = failed explicit rhs eval, retval = %i", retval);

      if (retval < 0) { return (ARK_RHSFUNC_FAIL); }
      if (retval > 0) { return (ARK_UNREC_RHSFUNC_ERR); }
    }

    /* if using a time-dependent mass matrix, update Fe[is] and/or Fi[is] with M(t)^{-1} */
    if (step_mem->mass_type == MASS_TIMEDEP)
    {
      /* If the implicit stage was deduced, it already includes M(t)^{-1} */
      if (step_mem->implicit && !deduce_stage)
      {
        *nflagPtr = step_mem->msolve((void*)ark_mem, step_mem->Fi[is],
                                     step_mem->nlscoef);

        SUNLogExtraDebugVec(ARK_LOGGER, "M^{-1} implicit RHS", step_mem->Fi[is],
                            "Fi_%i(:) =", is);

        if (*nflagPtr != ARK_SUCCESS)
        {
          SUNLogInfo(ARK_LOGGER, "end-stage",
                     "status = failed mass solve, nflag = %i", *nflagPtr);
          return (TRY_AGAIN);
        }
      }
      if (step_mem->explicit)
      {
        *nflagPtr = step_mem->msolve((void*)ark_mem, step_mem->Fe[is],
                                     step_mem->nlscoef);
        SUNLogExtraDebugVec(ARK_LOGGER, "M^{-1} explicit RHS", step_mem->Fe[is],
                            "Fe_%i(:) =", is);
        if (*nflagPtr != ARK_SUCCESS)
        {
          SUNLogInfo(ARK_LOGGER, "end-stage",
                     "status = failed mass solve, nflag = %i", *nflagPtr);
          return (TRY_AGAIN);
        }
      }
    }

    SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");

  } /* loop over stages */

  SUNLogInfo(ARK_LOGGER, "begin-compute-solution", "mass type = %i",
             step_mem->mass_type);

  /* compute time-evolved solution (in ark_ycur), error estimate (in dsm).
     This can fail recoverably due to nonconvergence of the mass matrix solve,
     so handle that appropriately. */
  if (step_mem->mass_type == MASS_FIXED)
  {
    *nflagPtr = arkStep_ComputeSolutions_MassFixed(ark_mem, dsmPtr);
  }
  else { *nflagPtr = arkStep_ComputeSolutions(ark_mem, dsmPtr); }

  SUNLogInfoIf(*nflagPtr != ARK_SUCCESS, ARK_LOGGER, "end-compute-solution",
               "status = failed compute solution, retval = %i", *nflagPtr);

  if (*nflagPtr < 0) { return (*nflagPtr); }
  if (*nflagPtr > 0) { return (TRY_AGAIN); }

  if (ark_mem->checkpoint_scheme)
  {
    sunbooleantype do_save;
    SUNErrCode errcode =
      SUNAdjointCheckpointScheme_NeedsSaving(ark_mem->checkpoint_scheme,
                                             ark_mem->checkpoint_step_idx,
                                             step_mem->Be->stages,
                                             ark_mem->tn + ark_mem->h, &do_save);
    if (errcode)
    {
      arkProcessError(ark_mem, ARK_ADJ_CHECKPOINT_FAIL, __LINE__, __func__,
                      __FILE__,
                      "SUNAdjointCheckpointScheme_NeedsSaving returned %d",
                      errcode);
      return ARK_ADJ_CHECKPOINT_FAIL;
    }
    if (do_save)
    {
      errcode =
        SUNAdjointCheckpointScheme_InsertVector(ark_mem->checkpoint_scheme,
                                                ark_mem->checkpoint_step_idx,
                                                step_mem->Be->stages,
                                                ark_mem->tn + ark_mem->h,
                                                ark_mem->ycur);
      if (errcode)
      {
        arkProcessError(ark_mem, ARK_ADJ_CHECKPOINT_FAIL, __LINE__, __func__,
                        __FILE__,
                        "SUNAdjointCheckpointScheme_NeedsSaving returned %d",
                        errcode);
        return ARK_ADJ_CHECKPOINT_FAIL;
      }
    }
  }

  SUNLogExtraDebugVec(ARK_LOGGER, "updated solution", ark_mem->ycur, "ycur(:) =");
  SUNLogInfo(ARK_LOGGER, "end-compute-solution", "status = success");

  return (ARK_SUCCESS);
}